

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowFontAtlas(ImFontAtlas *atlas)

{
  ImFont *font_00;
  ImTextureID user_texture_id;
  bool bVar1;
  ImFont **ppIVar2;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  undefined1 local_40 [8];
  ImVec4 border_col;
  ImVec4 tint_col;
  ImFont *font;
  int i;
  ImFontAtlas *atlas_local;
  
  for (font._4_4_ = 0; font._4_4_ < (atlas->Fonts).Size; font._4_4_ = font._4_4_ + 1) {
    ppIVar2 = ImVector<ImFont_*>::operator[](&atlas->Fonts,font._4_4_);
    font_00 = *ppIVar2;
    PushID(font_00);
    DebugNodeFont(font_00);
    PopID();
  }
  bVar1 = TreeNode("Atlas texture","Atlas texture (%dx%d pixels)",(ulong)(uint)atlas->TexWidth,
                   (ulong)(uint)atlas->TexHeight);
  if (bVar1) {
    ImVec4::ImVec4((ImVec4 *)&border_col.z,1.0,1.0,1.0,1.0);
    ImVec4::ImVec4((ImVec4 *)local_40,1.0,1.0,1.0,0.5);
    user_texture_id = atlas->TexID;
    ImVec2::ImVec2(&local_48,(float)atlas->TexWidth,(float)atlas->TexHeight);
    ImVec2::ImVec2(&local_50,0.0,0.0);
    ImVec2::ImVec2(&local_58,1.0,1.0);
    Image(user_texture_id,&local_48,&local_50,&local_58,(ImVec4 *)&border_col.z,(ImVec4 *)local_40);
    TreePop();
  }
  return;
}

Assistant:

void ImGui::ShowFontAtlas(ImFontAtlas* atlas)
{
    for (int i = 0; i < atlas->Fonts.Size; i++)
    {
        ImFont* font = atlas->Fonts[i];
        PushID(font);
        DebugNodeFont(font);
        PopID();
    }
    if (TreeNode("Atlas texture", "Atlas texture (%dx%d pixels)", atlas->TexWidth, atlas->TexHeight))
    {
        ImVec4 tint_col = ImVec4(1.0f, 1.0f, 1.0f, 1.0f);
        ImVec4 border_col = ImVec4(1.0f, 1.0f, 1.0f, 0.5f);
        Image(atlas->TexID, ImVec2((float)atlas->TexWidth, (float)atlas->TexHeight), ImVec2(0.0f, 0.0f), ImVec2(1.0f, 1.0f), tint_col, border_col);
        TreePop();
    }
}